

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dstu.c
# Opt level: O2

err_t dstuKeypairGen(octet *privkey,octet *pubkey,dstu_params *params,gen_i rng,void *rng_state)

{
  word *pwVar1;
  word *stack;
  qr_o *pqVar2;
  word *b;
  err_t eVar3;
  bool_t bVar4;
  size_t sVar5;
  ulong count;
  ec_o *ec_00;
  ulong n;
  word *a;
  ec_o *ec;
  size_t local_50;
  word *local_48;
  ec_o *local_40;
  octet *local_38;
  
  ec = (ec_o *)0x0;
  if (rng == (gen_i)0x0) {
    eVar3 = 0x130;
  }
  else {
    eVar3 = dstuEcCreate(&ec,params,dstuKeypairGen_deep);
    ec_00 = ec;
    if (eVar3 == 0) {
      sVar5 = wwBitSize(ec->order,ec->f->n);
      count = sVar5 + 7 >> 3;
      local_38 = privkey;
      bVar4 = memIsValid(privkey,count);
      eVar3 = 0x6d;
      if ((bVar4 != 0) && (bVar4 = memIsValid(pubkey,ec_00->f->no * 2), bVar4 != 0)) {
        n = sVar5 + 0x3f >> 6;
        a = (word *)((long)&(ec_00->hdr).keep + (ec_00->hdr).keep);
        local_40 = ec_00;
        local_50 = ec_00->f->n;
        local_48 = a + local_50;
        pwVar1 = local_48 + local_50;
        wwSetZero(a,n);
        do {
          (*rng)(a,count,rng_state);
          u64From(a,a,count);
          wwTrimHi(a,n,sVar5 - 1);
          bVar4 = wwIsZero(a,n);
          ec_00 = local_40;
          b = local_48;
        } while (bVar4 != 0);
        stack = pwVar1 + local_50;
        bVar4 = ecMulA(local_48,local_40->base,local_40,a,n,stack);
        if (bVar4 == 0) {
          eVar3 = 0x1f6;
        }
        else {
          ec2NegA(b,b,ec_00);
          u64To(local_38,count,a);
          (*ec_00->f->to)(pubkey,b,ec_00->f,stack);
          pqVar2 = ec_00->f;
          (*pqVar2->to)(pubkey + pqVar2->no,pwVar1,pqVar2,stack);
          eVar3 = 0;
        }
      }
      blobClose(ec_00);
    }
  }
  return eVar3;
}

Assistant:

err_t dstuKeypairGen(octet privkey[], octet pubkey[], 
	const dstu_params* params, gen_i rng, void* rng_state)
{
	err_t code;
	size_t order_n, order_no, order_nb;
	// состояние
	ec_o* ec = 0;
	word* d;
	word* x;
	word* y;
	void* stack;
	// проверить rng
	if (rng == 0)
		return ERR_BAD_RNG;
	// старт
	code = dstuEcCreate(&ec, params, dstuKeypairGen_deep);
	ERR_CALL_CHECK(code);
	// размерности order
	order_nb = wwBitSize(ec->order, ec->f->n);
	order_no = O_OF_B(order_nb);
	order_n = W_OF_B(order_nb);
	// проверить входные указатели
	if (!memIsValid(privkey, order_no) || 
		!memIsValid(pubkey, 2 * ec->f->no))
	{
		dstuEcClose(ec);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	d = objEnd(ec, word);
	x = d + ec->f->n;
	y = x + ec->f->n;
	stack = y + ec->f->n;
	// d <-R {1,2,..., order - 1}
	// [алгоритм из раздела 6.3 ДСТУ --- обрезка d]
	wwSetZero(d, order_n);
	while (1)
	{
		rng(d, O_OF_B(order_nb), rng_state);
		wwFrom(d, d, O_OF_B(order_nb));
		wwTrimHi(d, order_n, order_nb - 1);
		ASSERT(wwCmp(d, ec->order, order_n) < 0);
		// 0 < d?
		if (!wwIsZero(d, order_n))
			break;
	}
	// Q <- d G
	if (!ecMulA(x, ec->base, ec, d, order_n, stack))
	{
		// если params корректны, то этого быть не должно
		dstuEcClose(ec);
		return ERR_BAD_PARAMS;
	}
	// Q <- -Q
	ec2NegA(x, x, ec);
	// выгрузить ключи
	wwTo(privkey, order_no, d);
	qrTo(pubkey, x, ec->f, stack);
	qrTo(pubkey + ec->f->no, y, ec->f, stack);
	// все нормально
	dstuEcClose(ec);
	return code;
}